

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  string_view sVar1;
  bool bVar2;
  reference this_00;
  char *pcVar3;
  size_type sVar4;
  cmGeneratorTarget *local_e0;
  cmGeneratorTarget *objLib;
  undefined1 local_d0 [8];
  string objLibName;
  string *li;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  cmBTStringRange rng;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs_local;
  cmGeneratorTarget *this_local;
  
  rng.End._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       objlibs;
  ___range1 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&__range1);
  entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&entry), bVar2) {
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         &__gnu_cxx::
          __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator*(&__end1)->Value;
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)
                       files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,sVar1,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60);
    li = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&li), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      bVar2 = cmHasLiteralPrefix<18ul>(sVar1,(char (*) [18])"$<TARGET_OBJECTS:");
      if ((bVar2) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == '>')) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_d0,(ulong)this_00);
        sVar4 = cmGeneratorExpression::Find((string *)local_d0);
        if (sVar4 == 0xffffffffffffffff) {
          local_e0 = cmLocalGenerator::FindGeneratorTargetToUse
                               (this->LocalGenerator,(string *)local_d0);
          if (local_e0 != (cmGeneratorTarget *)0x0) {
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                       rng.End._M_current,&local_e0);
          }
          objLib._4_4_ = 0;
        }
        else {
          objLib._4_4_ = 5;
        }
        std::__cxx11::string::~string((string *)local_d0);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    __gnu_cxx::
    __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmBTStringRange rng = this->Target->GetSourceEntries();
  for (auto const& entry : rng) {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    for (std::string const& li : files) {
      if (cmHasLiteralPrefix(li, "$<TARGET_OBJECTS:") && li.back() == '>') {
        std::string objLibName = li.substr(17, li.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}